

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Build_Map.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Build_Map::Build_Node
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Build_Map *this,
          vector<double,_std::allocator<double>_> *Discrete)

{
  double dVar1;
  initializer_list<int> __l;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *this_00;
  allocator<int> local_4d;
  int local_4c;
  int local_48;
  int local_44;
  iterator local_40;
  size_type local_38;
  undefined1 local_2d;
  int local_2c;
  int local_28;
  int Z_Init;
  int Y_Init;
  int X_Init;
  vector<double,_std::allocator<double>_> *Discrete_local;
  Build_Map *this_local;
  vector<int,_std::allocator<int>_> *Built_Node;
  
  _Y_Init = Discrete;
  Discrete_local = (vector<double,_std::allocator<double>_> *)this;
  this_local = (Build_Map *)__return_storage_ptr__;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](Discrete,0);
  dVar1 = *pvVar2;
  this_00 = &this->Boundary;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
  Z_Init = (int)((dVar1 - *pvVar2) / this->xy_res);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](Discrete,1);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
  local_28 = (int)((dVar1 - *pvVar2) / this->xy_res);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](Discrete,2);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,2);
  local_44 = (int)((dVar1 - *pvVar2) / this->z_res);
  local_2d = 0;
  local_4c = Z_Init;
  local_48 = local_28;
  local_40 = &local_4c;
  local_38 = 3;
  local_2c = local_44;
  std::allocator<int>::allocator(&local_4d);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_4d);
  std::allocator<int>::~allocator(&local_4d);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Build_Map::Build_Node(std::vector<double> Discrete) {
  int X_Init = (Discrete[0] - Boundary[0]) / xy_res;
  int Y_Init = (Discrete[1] - Boundary[1]) / xy_res;
  int Z_Init = (Discrete[2] - Boundary[2]) / z_res;
  std::vector<int> Built_Node = { X_Init, Y_Init, Z_Init };
  return Built_Node;
}